

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int ffphext(fitsfile *fptr,char *xtensionx,int bitpix,int naxis,long *naxes,LONGLONG pcount,
           LONGLONG gcount,int *status)

{
  ulong uVar1;
  FITSfile *pFVar2;
  int iVar3;
  ulong uVar4;
  char name [20];
  char comm [81];
  char xtension [71];
  char message [81];
  
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  iVar3 = *status;
  if (iVar3 < 1) {
    pFVar2 = fptr->Fptr;
    if (pFVar2->headend == pFVar2->headstart[pFVar2->curhdu]) {
      if ((uint)naxis < 1000) {
        xtension[0] = '\0';
        strncat(xtension,xtensionx,0x46);
        ffpkys(fptr,"XTENSION",xtension,"extension type",status);
        ffpkyj(fptr,"BITPIX",(long)bitpix,"number of bits per data pixel",status);
        ffpkyj(fptr,"NAXIS",(ulong)(uint)naxis,"number of data axes",status);
        builtin_strncpy(comm + 0x10,"xis ",5);
        builtin_strncpy(comm,"length of data a",0x10);
        uVar4 = 0;
        while ((uint)naxis != uVar4) {
          if (naxes[uVar4] < 0) {
            snprintf(message,0x51,"Illegal negative value for NAXIS%d keyword: %.0f",
                     (double)naxes[uVar4],(ulong)((int)uVar4 + 1));
            ffpmsg(message);
            *status = 0xd5;
            return 0xd5;
          }
          uVar1 = uVar4 + 1;
          snprintf(comm + 0x14,0x3d,"%d",uVar1 & 0xffffffff);
          ffkeyn("NAXIS",(int)uVar1,name,status);
          ffpkyj(fptr,name,naxes[uVar4],comm,status);
          uVar4 = uVar1;
        }
        ffpkyj(fptr,"PCOUNT",pcount," ",status);
        ffpkyj(fptr,"GCOUNT",gcount," ",status);
        iVar3 = *status;
        if (0 < iVar3) {
          ffpmsg("Failed to write extension header keywords (ffphext)");
          iVar3 = *status;
        }
      }
      else {
        snprintf(message,0x51,"Illegal value for NAXIS keyword: %d",(ulong)(uint)naxis);
        ffpmsg(message);
        *status = 0xd4;
        iVar3 = 0xd4;
      }
    }
    else {
      *status = 0xc9;
      iVar3 = 0xc9;
    }
  }
  return iVar3;
}

Assistant:

int ffphext(fitsfile *fptr,  /* I - FITS file pointer                       */
           const char *xtensionx,   /* I - value for the XTENSION keyword          */
           int bitpix,       /* I - value for the BIXPIX keyword            */
           int naxis,        /* I - value for the NAXIS keyword             */
           long naxes[],     /* I - value for the NAXISn keywords           */
           LONGLONG pcount,  /* I - value for the PCOUNT keyword            */
           LONGLONG gcount,  /* I - value for the GCOUNT keyword            */
           int *status)      /* IO - error status                           */
/*
  Put required Header keywords into a conforming extension:
*/
{
    char message[FLEN_ERRMSG],comm[81], name[20], xtension[FLEN_VALUE];
    int ii;
 
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (*status > 0)
        return(*status);
    else if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status = HEADER_NOT_EMPTY);

    if (naxis < 0 || naxis > 999)
    {
        snprintf(message,FLEN_ERRMSG,
        "Illegal value for NAXIS keyword: %d", naxis);
        ffpmsg(message);
        return(*status = BAD_NAXIS);
    }

    xtension[0] = '\0';
    strncat(xtension, xtensionx, FLEN_VALUE-1);

    ffpkys(fptr, "XTENSION", xtension, "extension type", status);
    ffpkyj(fptr, "BITPIX",   bitpix,   "number of bits per data pixel", status);
    ffpkyj(fptr, "NAXIS",    naxis,    "number of data axes", status);

    strcpy(comm, "length of data axis ");
    for (ii = 0; ii < naxis; ii++)
    {
        if (naxes[ii] < 0)
        {
            snprintf(message,FLEN_ERRMSG,
            "Illegal negative value for NAXIS%d keyword: %.0f", ii + 1, (double) (naxes[ii]));
            ffpmsg(message);
            return(*status = BAD_NAXES);
        }

        snprintf(&comm[20], 61, "%d", ii + 1);
        ffkeyn("NAXIS", ii + 1, name, status);
        ffpkyj(fptr, name, naxes[ii], comm, status);
    }


    ffpkyj(fptr, "PCOUNT", pcount, " ", status);
    ffpkyj(fptr, "GCOUNT", gcount, " ", status);

    if (*status > 0)
        ffpmsg("Failed to write extension header keywords (ffphext)");

    return(*status);
}